

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O3

void * fe_load_effect(fe_state *s,fe_effect *effect)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int pin;
  char *pcVar4;
  fe_node **ppfVar5;
  fe_node *pfVar6;
  fe_node *dest;
  int i;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  char *pcVar11;
  float fVar12;
  
  effect->text[0] = '\0';
  effect->path_back[0] = '\0';
  effect->path_font[0] = '\0';
  effect->distance = 1.0;
  effect->px = -999;
  effect->py = -999;
  read_fixed(s,"#");
  if ((s->error != true) && (read_token(s), s->error != true)) {
    pcVar4 = s->token;
    lVar7 = 0;
    do {
      effect->id[lVar7] = pcVar4[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    read_fixed(s,"size:");
    if (s->error != true) {
      read_token(s);
      iVar2 = atoi(s->token);
      effect->size = iVar2;
      if (s->error == false) {
        cVar1 = *s->data;
        while (cVar1 != '@') {
          read_token(s);
          bVar10 = s->error;
          if ((bool)bVar10 == true) goto LAB_001104a3;
          pcVar4 = s->token;
          iVar2 = strcmp(pcVar4,"distance");
          if (iVar2 == 0) {
            fVar12 = read_float(s);
            effect->distance = fVar12;
LAB_00110273:
            if (s->error == true) goto LAB_001104a3;
          }
          else {
            iVar2 = strcmp(pcVar4,"pos");
            if (iVar2 == 0) {
              read_token(s);
              iVar2 = atoi(s->token);
              effect->px = (short)iVar2;
              if (s->error != true) {
                read_token(s);
                iVar2 = atoi(s->token);
                effect->py = (short)iVar2;
                goto LAB_00110273;
              }
              goto LAB_001104a3;
            }
            iVar2 = strcmp(pcVar4,"font");
            pcVar11 = (char *)0x0;
            if (iVar2 == 0) {
              pcVar11 = effect->path_font;
            }
            iVar3 = strcmp(pcVar4,"back");
            if (iVar3 == 0) {
              pcVar11 = effect->path_back;
            }
            uVar9 = (uint)(iVar3 == 0 || iVar2 == 0) << 8;
            iVar2 = strcmp(pcVar4,"text");
            if (iVar2 == 0) {
              uVar9 = 0x20;
              pcVar11 = effect->text;
            }
            pcVar4 = s->data;
            s->token = pcVar4;
            if (0 < s->size) {
              iVar2 = s->size + 1;
              do {
                cVar1 = *pcVar4;
                if ((cVar1 == '\0') || (cVar1 == '\n')) {
LAB_0011029c:
                  *pcVar4 = '\0';
                  s->data = s->data + 1;
                  s->size = s->size + -1;
                  bVar10 = s->error;
                  break;
                }
                if (cVar1 == '\r') {
                  *pcVar4 = '\0';
                  if (0 < s->size) {
                    pcVar4 = s->data + 1;
                    s->data = pcVar4;
                    s->size = s->size + -1;
                    goto LAB_0011029c;
                  }
                  s->error = true;
                  goto LAB_001104a3;
                }
                pcVar4 = pcVar4 + 1;
                s->data = pcVar4;
                s->size = iVar2 + -2;
                iVar2 = iVar2 + -1;
              } while (1 < iVar2);
            }
            if ((bVar10 & 1) != 0) goto LAB_001104a3;
            if (uVar9 != 0) {
              pcVar4 = s->token;
              uVar8 = 0;
              do {
                pcVar11[uVar8] = pcVar4[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar9 != uVar8);
            }
          }
          cVar1 = *s->data;
        }
        read_fixed(s,"@nodes");
        if ((s->error != true) && (next_line(s), s->error != true)) {
          if (s->size < 1) {
            uVar9 = 0;
          }
          else {
            lVar7 = 0;
            uVar9 = 0;
            do {
              uVar9 = (s->data[lVar7] == '*') + uVar9;
              if (s->data[lVar7] == '@') break;
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < s->size);
          }
          effect->num = uVar9;
          ppfVar5 = (fe_node **)_fe_alloc((long)(int)uVar9 * 8);
          effect->nodes = ppfVar5;
          if (0 < (int)uVar9) {
            uVar8 = 0;
            do {
              pfVar6 = fe_load_node(s);
              pfVar6->effect = effect;
              pfVar6->index = (int)uVar8;
              effect->nodes[uVar8] = pfVar6;
              if (s->error == true) goto LAB_001104a3;
              if (pfVar6->type == 0x32) {
                effect->out_node = pfVar6;
              }
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          read_fixed(s,"@edges");
          if ((s->error == false) && (next_line(s), s->error != true)) {
            pcVar4 = s->data;
            if (*pcVar4 == '*') {
              pfVar6 = *effect->nodes;
              dest = pfVar6;
              do {
                s->data = pcVar4 + 1;
                s->size = s->size + -1;
                read_token(s);
                if (s->error == true) goto LAB_001104a3;
                iVar2 = atoi(s->token);
                read_token(s);
                if (s->error == true) goto LAB_001104a3;
                iVar3 = atoi(s->token);
                read_token(s);
                if (s->error == true) goto LAB_001104a3;
                pin = atoi(s->token);
                if (pfVar6->id != iVar2) {
                  pfVar6 = fe_effect_find_node(effect,iVar2);
                }
                if (dest->id != iVar3) {
                  dest = fe_effect_find_node(effect,iVar3);
                }
                _fe_node_connect(pfVar6,dest,pin);
                pcVar4 = s->data;
              } while (*pcVar4 == '*');
            }
            return (void *)0x0;
          }
        }
      }
    }
  }
LAB_001104a3:
  __assert_fail("!\"fe parse error\"",
                "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/fe_bundle.cpp"
                ,0x2c,"void error()");
}

Assistant:

void* fe_load_effect(fe_state& s, fe_effect* effect)
{
    effect->text[0] = 0;
    effect->path_back[0] = 0;
    effect->path_font[0] = 0;
    effect->distance = 1.0f;
	effect->px = -999;
	effect->py = -999;

    read_fixed(s, "#");
    CHECK_ERR();

    read_token(s);
    CHECK_ERR();
    safe_strcpy(effect->id, s.token);

    read_fixed(s, "size:");
    CHECK_ERR();

    effect->size = READ_INT(s);


    while (s.data[0] != '@')
    {
        read_token(s);
        CHECK_ERR();

        if (!strcmp(s.token, "distance"))
        {
            effect->distance = READ_FLOAT(s);
            continue;
        }


		if (!strcmp(s.token, "pos"))
		{
			effect->px = READ_INT(s);
			effect->py = READ_INT(s);
			continue;
		}

        char *param = 0;
        int len = 0;
        if (!strcmp(s.token, "font"))
        {
            len = sizeof(effect->path_font);
            param = effect->path_font;
        }
        if (!strcmp(s.token, "back"))
        {
            len = sizeof(effect->path_back);
            param = effect->path_back;
        }
        if (!strcmp(s.token, "text"))
        {
            len = sizeof(effect->text);
            param = effect->text;
        }

        

        read_token_end_line(s);
        CHECK_ERR();
        safe_strcpy(param, len, s.token);
    }
    
    read_fixed(s, "@nodes");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();

    int num = 0;
    const char* p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '@')
            break;
        ++p;
    }

    effect->num = num;
    effect->nodes = (fe_node**)_fe_alloc(sizeof(fe_node*) * num);

    for (int i = 0; i < num; ++i)
    {
        fe_node *node = fe_load_node(s);
        node->effect = effect;
        node->index = i;

        effect->nodes[i] = node;
        CHECK_ERR();      


        if (node->type == fe_node_type_out)
            effect->out_node = node;
    }

    read_fixed(s, "@edges");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();


    num = 0;
    p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '#')
            break;
        ++p;
    }


    fe_node* srcLast = effect->nodes[0];
    fe_node* destLast = effect->nodes[0];
    while (*s.data == '*')
    {
        s.data++;
        s.size--;

        read_token(s);
        CHECK_ERR();

        int sn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dp = atoi(s.token);

        if (srcLast->id != sn)
            srcLast = fe_effect_find_node(effect, sn);

        if (destLast->id != dn)
            destLast = fe_effect_find_node(effect, dn);

        _fe_node_connect(srcLast, destLast, dp);
    }



    return 0;
}